

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O2

QString * __thiscall
QDateTimeEdit::displayFormat(QString *__return_storage_ptr__,QDateTimeEdit *this)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  
  lVar1 = *(long *)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
  bVar2 = QWidget::isRightToLeft((QWidget *)this);
  lVar3 = 0x438;
  if (bVar2) {
    lVar3 = 0x4c0;
  }
  QArrayDataPointer<char16_t>::QArrayDataPointer
            (&__return_storage_ptr__->d,(QArrayDataPointer<char16_t> *)(lVar3 + lVar1));
  return __return_storage_ptr__;
}

Assistant:

QString QDateTimeEdit::displayFormat() const
{
    Q_D(const QDateTimeEdit);
    return isRightToLeft() ? d->unreversedFormat : d->displayFormat;
}